

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O3

void utrie2_set32ForLeadSurrogateCodeUnit_63
               (UTrie2 *trie,UChar32 c,uint32_t value,UErrorCode *pErrorCode)

{
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if ((c & 0xfffffc00U) == 0xd800) {
    set32(trie->newTrie,c,'\0',value,pErrorCode);
    return;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}